

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     operate<andres::marray_detail::PlusEqual<short,short>,short,std::allocator<unsigned_long>>
               (View<short,_false,_std::allocator<unsigned_long>_> *v,short *x)

{
  bool bVar1;
  size_t sVar2;
  reference psVar3;
  reference x_00;
  undefined1 local_70 [8];
  iterator it;
  ulong local_30;
  size_t j;
  short *data;
  short *x_local;
  View<short,_false,_std::allocator<unsigned_long>_> *v_local;
  
  bVar1 = View<short,_false,_std::allocator<unsigned_long>_>::isSimple(v);
  if (bVar1) {
    psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                       ((View<short,false,std::allocator<unsigned_long>> *)v,0);
    for (local_30 = 0; sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::size(v),
        local_30 < sVar2; local_30 = local_30 + 1) {
      PlusEqual<short,_short>::operator()
                ((PlusEqual<short,_short> *)((long)&v_local + 7),psVar3 + local_30,x);
    }
  }
  else {
    sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar2 == 1) {
      psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar3);
    }
    else {
      sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar2 == 2) {
        psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                           ((View<short,false,std::allocator<unsigned_long>> *)v,0);
        OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
        ::operate(v,x,psVar3);
      }
      else {
        sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
        if (sVar2 == 3) {
          psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                             ((View<short,false,std::allocator<unsigned_long>> *)v,0);
          OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
          ::operate(v,x,psVar3);
        }
        else {
          sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar2 == 4) {
            psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                               ((View<short,false,std::allocator<unsigned_long>> *)v,0);
            OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
            ::operate(v,x,psVar3);
          }
          else {
            sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
            if (sVar2 == 5) {
              psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                                 ((View<short,false,std::allocator<unsigned_long>> *)v,0);
              OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
              ::operate(v,x,psVar3);
            }
            else {
              sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
              if (sVar2 == 6) {
                psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                                   ((View<short,false,std::allocator<unsigned_long>> *)v,0);
                OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
                ::operate(v,x,psVar3);
              }
              else {
                sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
                if (sVar2 == 7) {
                  psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                                     ((View<short,false,std::allocator<unsigned_long>> *)v,0);
                  OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
                  ::operate(v,x,psVar3);
                }
                else {
                  sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
                  if (sVar2 == 8) {
                    psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                                       ((View<short,false,std::allocator<unsigned_long>> *)v,0);
                    OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
                    ::operate(v,x,psVar3);
                  }
                  else {
                    sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
                    if (sVar2 == 9) {
                      psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
                      OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
                      ::operate(v,x,psVar3);
                    }
                    else {
                      sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
                      if (sVar2 == 10) {
                        psVar3 = View<short,false,std::allocator<unsigned_long>>::operator()
                                           ((View<short,false,std::allocator<unsigned_long>> *)v,0);
                        OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
                        ::operate(v,x,psVar3);
                      }
                      else {
                        View<short,_false,_std::allocator<unsigned_long>_>::begin
                                  ((iterator *)local_70,v);
                        while (bVar1 = Iterator<short,_false,_std::allocator<unsigned_long>_>::
                                       hasMore((Iterator<short,_false,_std::allocator<unsigned_long>_>
                                                *)local_70), bVar1) {
                          x_00 = Iterator<short,_false,_std::allocator<unsigned_long>_>::operator*
                                           ((Iterator<short,_false,_std::allocator<unsigned_long>_>
                                             *)local_70);
                          PlusEqual<short,_short>::operator()
                                    ((PlusEqual<short,_short> *)((long)&v_local + 7),x_00,x);
                          Iterator<short,_false,_std::allocator<unsigned_long>_>::operator++
                                    ((Iterator<short,_false,_std::allocator<unsigned_long>_> *)
                                     local_70);
                        }
                        Iterator<short,_false,_std::allocator<unsigned_long>_>::~Iterator
                                  ((Iterator<short,_false,_std::allocator<unsigned_long>_> *)
                                   local_70);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void 
operate
(
    View<T, false, A>& v, 
    const T& x, 
    Functor f
)
{
    if(v.isSimple()) {
        T* data = &v(0);
        for(std::size_t j=0; j<v.size(); ++j) {
            f(data[j], x);
        }
    }
    else if(v.dimension() == 1)
        OperateHelperBinaryScalar<1, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 2)
        OperateHelperBinaryScalar<2, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 3)
        OperateHelperBinaryScalar<3, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 4)
        OperateHelperBinaryScalar<4, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 5)
        OperateHelperBinaryScalar<5, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 6)
        OperateHelperBinaryScalar<6, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 7)
        OperateHelperBinaryScalar<7, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 8)
        OperateHelperBinaryScalar<8, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 9)
        OperateHelperBinaryScalar<9, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 10)
        OperateHelperBinaryScalar<10, Functor, T, T, A>::operate(v, x, f, &v(0));
    else {
        for(typename View<T, false, A>::iterator it = v.begin(); it.hasMore(); ++it) {
            f(*it, x); 
        }
    }
}